

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int removeNode(Rtree *pRtree,RtreeNode *pNode,int iHeight)

{
  ulong uVar1;
  RtreeNode **ppRVar2;
  int iVar3;
  int iVar4;
  RtreeNode **ppRVar5;
  RtreeNode *pRVar6;
  long in_FS_OFFSET;
  int local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pRVar6 = pNode->pParent;
  if (pRVar6 == (RtreeNode *)0x0) {
    iVar4 = -1;
  }
  else {
    local_34 = -0x55555556;
    iVar3 = nodeRowidIndex(pRtree,(RtreeNode *)pRVar6->zData,pNode->iNode,&local_34);
    iVar4 = local_34;
    if (iVar3 != 0) {
      pRVar6 = (RtreeNode *)0x0;
      goto LAB_001fa2dd;
    }
  }
  pNode->pParent = (RtreeNode *)0x0;
  iVar3 = deleteCell(pRtree,pRVar6,iVar4,iHeight + 1);
LAB_001fa2dd:
  iVar4 = nodeRelease(pRtree,pRVar6);
  if (iVar3 != 0) {
    iVar4 = iVar3;
  }
  if (iVar4 == 0) {
    sqlite3_bind_int64(pRtree->pDeleteNode,1,pNode->iNode);
    sqlite3_step(pRtree->pDeleteNode);
    iVar4 = sqlite3_reset(pRtree->pDeleteNode);
    if (iVar4 == 0) {
      sqlite3_bind_int64(pRtree->pDeleteParent,1,pNode->iNode);
      sqlite3_step(pRtree->pDeleteParent);
      iVar4 = sqlite3_reset(pRtree->pDeleteParent);
      if (iVar4 == 0) {
        uVar1 = pNode->iNode;
        if (uVar1 != 0) {
          iVar4 = (int)((uVar1 & 0xffffffff) * 0x51d07eaf >> 0x20);
          ppRVar2 = pRtree->aHash +
                    ((int)uVar1 + (((uint)((int)uVar1 - iVar4) >> 1) + iVar4 >> 6) * -0x61);
          do {
            ppRVar5 = ppRVar2;
            pRVar6 = *ppRVar5;
            ppRVar2 = &pRVar6->pNext;
          } while (pRVar6 != pNode);
          *ppRVar5 = pNode->pNext;
        }
        pNode->iNode = (long)iHeight;
        pNode->pNext = pRtree->pDeleted;
        pNode->nRef = pNode->nRef + 1;
        pRtree->pDeleted = pNode;
        iVar4 = 0;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

static int removeNode(Rtree *pRtree, RtreeNode *pNode, int iHeight){
  int rc;
  int rc2;
  RtreeNode *pParent = 0;
  int iCell;

  assert( pNode->nRef==1 );

  /* Remove the entry in the parent cell. */
  rc = nodeParentIndex(pRtree, pNode, &iCell);
  if( rc==SQLITE_OK ){
    pParent = pNode->pParent;
    pNode->pParent = 0;
    rc = deleteCell(pRtree, pParent, iCell, iHeight+1);
    testcase( rc!=SQLITE_OK );
  }
  rc2 = nodeRelease(pRtree, pParent);
  if( rc==SQLITE_OK ){
    rc = rc2;
  }
  if( rc!=SQLITE_OK ){
    return rc;
  }

  /* Remove the xxx_node entry. */
  sqlite3_bind_int64(pRtree->pDeleteNode, 1, pNode->iNode);
  sqlite3_step(pRtree->pDeleteNode);
  if( SQLITE_OK!=(rc = sqlite3_reset(pRtree->pDeleteNode)) ){
    return rc;
  }

  /* Remove the xxx_parent entry. */
  sqlite3_bind_int64(pRtree->pDeleteParent, 1, pNode->iNode);
  sqlite3_step(pRtree->pDeleteParent);
  if( SQLITE_OK!=(rc = sqlite3_reset(pRtree->pDeleteParent)) ){
    return rc;
  }

  /* Remove the node from the in-memory hash table and link it into
  ** the Rtree.pDeleted list. Its contents will be re-inserted later on.
  */
  nodeHashDelete(pRtree, pNode);
  pNode->iNode = iHeight;
  pNode->pNext = pRtree->pDeleted;
  pNode->nRef++;
  pRtree->pDeleted = pNode;

  return SQLITE_OK;
}